

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FS.cpp
# Opt level: O1

void __thiscall File::append(File *this,string *line)

{
  int iVar1;
  string *__return_storage_ptr__;
  int *piVar2;
  char *args;
  int in_EDX;
  string local_48;
  
  if (this->_fh == (FILE *)0x0) {
    open(this,(char *)line,in_EDX);
  }
  if ((FILE *)this->_fh != (FILE *)0x0) {
    fseek((FILE *)this->_fh,0,2);
    iVar1 = fputs((line->_M_dataplus)._M_p,(FILE *)this->_fh);
    if (iVar1 == -1) {
      __return_storage_ptr__ = (string *)__cxa_allocate_exception(0x20);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"fputs error {1}: {2}","")
      ;
      piVar2 = __errno_location();
      iVar1 = *piVar2;
      args = strerror(iVar1);
      format<int,char*>(__return_storage_ptr__,1,&local_48,iVar1,args);
      __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                  std::__cxx11::string::~string);
    }
  }
  return;
}

Assistant:

void File::append (const std::string& line)
{
  if (!_fh)
    open ();

  if (_fh)
  {
    fseek (_fh, 0, SEEK_END);

    if (fputs (line.c_str (), _fh) == EOF)
      throw format ("fputs error {1}: {2}", errno, strerror (errno));
  }
}